

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::quantize_float32_to_int8(Mat *src,Mat *dst,float scale,Option *opt)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  Layer *pLVar3;
  long lVar4;
  ParamDict pd;
  ParamDict local_928;
  
  pLVar3 = create_layer(0x39);
  ParamDict::ParamDict(&local_928);
  ParamDict::set(&local_928,0,scale);
  (*pLVar3->_vptr_Layer[2])(pLVar3,&local_928);
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  (*pLVar3->_vptr_Layer[7])(pLVar3,src,dst,opt);
  (*pLVar3->_vptr_Layer[5])(pLVar3,opt);
  (*pLVar3->_vptr_Layer[1])(pLVar3);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&local_928.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_928.params[0].type + lVar4);
        plVar2 = *(long **)((long)&local_928.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_928.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_928.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_928.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&local_928.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_928.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_928.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_928.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return;
}

Assistant:

void quantize_float32_to_int8(const Mat& src, Mat& dst, float scale, const Option& opt)
{
    Layer* quantize = create_layer(LayerType::Quantize);

    ParamDict pd;
    pd.set(0, scale);

    quantize->load_param(pd);

    quantize->create_pipeline(opt);

    quantize->forward(src, dst, opt);

    quantize->destroy_pipeline(opt);

    delete quantize;
}